

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O3

bool dxil_spv::validate_wmma_io_registers
               (Impl *impl,uint32_t base_argument,
               AmdExtD3DShaderIntrinsicsWaveMatrixRegType reg_type,uint32_t phase,
               bool input_validation)

{
  _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  Id IVar1;
  ValueKind VVar2;
  uint uVar3;
  Id IVar4;
  Value *pVVar5;
  Value *value;
  Value *this_00;
  iterator iVar6;
  iterator iVar7;
  uint uVar8;
  uint32_t i;
  ulong uVar9;
  bool bVar10;
  Value *value1;
  Value *value0;
  ulong local_68;
  Value *local_50;
  Value *local_48;
  _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  ulong local_38;
  
  if (reg_type == AmdExtD3DShaderIntrinsicsWaveMatrixRegType_RetVal_Reg && !input_validation) {
    uVar9 = 0;
    while( true ) {
      uVar3 = base_argument + (uint)uVar9;
      uVar8 = (impl->ags).instructions[uVar3].immediate;
      if (0xff < uVar8) {
        return false;
      }
      if ((impl->ags).instructions[uVar3].phase != phase) {
        return false;
      }
      if ((uVar8 & 0xf) != ((uint)uVar9 & 3)) {
        return false;
      }
      if (uVar8 >> 4 != ((uint)(uVar9 >> 2) & 0x3fffffff)) break;
      uVar9 = uVar9 + 1;
      if (uVar9 == 8) {
        return true;
      }
    }
    return false;
  }
  pVVar5 = LLVMBC::Instruction::getOperand
                     (&(impl->ags).backdoor_instructions[base_argument]->super_Instruction,5);
  uVar9 = 0;
  IVar1 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
  do {
    uVar8 = (int)uVar9 + base_argument;
    pVVar5 = LLVMBC::Instruction::getOperand
                       (&(impl->ags).backdoor_instructions[uVar8]->super_Instruction,5);
    value = LLVMBC::Instruction::getOperand
                      (&(impl->ags).backdoor_instructions[uVar8]->super_Instruction,6);
    this_00 = LLVMBC::Internal::resolve_proxy(pVVar5);
    VVar2 = LLVMBC::Value::get_value_kind(this_00);
    if (VVar2 != PHI) {
      pVVar5 = LLVMBC::Internal::resolve_proxy(pVVar5);
      VVar2 = LLVMBC::Value::get_value_kind(pVVar5);
      if (VVar2 != Load) {
        bVar10 = false;
LAB_0017c261:
        local_40 = &(impl->ags).coopmat_component_mapping._M_h;
        local_68 = 1;
        uVar9 = 0;
        local_38 = (ulong)base_argument;
        while( true ) {
          uVar8 = (int)local_38 + (uint)uVar9;
          local_48 = LLVMBC::Instruction::getOperand
                               (&(impl->ags).backdoor_instructions[uVar8]->super_Instruction,5);
          local_50 = LLVMBC::Instruction::getOperand
                               (&(impl->ags).backdoor_instructions[uVar8]->super_Instruction,6);
          this = local_40;
          iVar6 = std::
                  _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(local_40,&local_48);
          iVar7 = std::
                  _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(this,&local_50);
          if ((((impl->ags).instructions[uVar8].phase != phase) ||
              (iVar6.
               super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
               ._M_cur == (__node_type *)0x0)) ||
             (local_68 - 1 !=
              (ulong)*(uint *)((long)iVar6.
                                     super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                                     ._M_cur + 0x14))) {
            return false;
          }
          if (bVar10) {
            if (iVar7.
                super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                ._M_cur == (__node_type *)0x0) {
              return false;
            }
            if (local_68 !=
                *(uint *)((long)iVar7.
                                super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                                ._M_cur + 0x14)) {
              return false;
            }
          }
          else {
            IVar4 = Converter::Impl::get_id_for_value(impl,local_48,0);
            if (IVar4 != IVar1) {
              return false;
            }
            if (iVar7.
                super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                ._M_cur == (__node_type *)0x0) {
              return false;
            }
            if (local_68 !=
                *(uint *)((long)iVar7.
                                super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                                ._M_cur + 0x14)) {
              return false;
            }
            IVar4 = Converter::Impl::get_id_for_value(impl,local_50,0);
            if (IVar4 != IVar1) {
              return false;
            }
          }
          uVar8 = (impl->ags).instructions[uVar8].immediate;
          if (0x7ff < uVar8) {
            return false;
          }
          if ((uVar8 >> 8 & 0xff) != reg_type) {
            return false;
          }
          if ((uVar8 & 0xf) != ((uint)uVar9 & 1)) {
            return false;
          }
          if ((uVar8 >> 4 & 0xf) != ((uint)(uVar9 >> 1) & 0x7fffffff)) break;
          uVar9 = uVar9 + 1;
          local_68 = local_68 + 2;
          if (uVar9 == 4) {
            return true;
          }
        }
        return false;
      }
    }
    pVVar5 = LLVMBC::Internal::resolve_proxy(value);
    VVar2 = LLVMBC::Value::get_value_kind(pVVar5);
    bVar10 = true;
    if (VVar2 != PHI) {
      pVVar5 = LLVMBC::Internal::resolve_proxy(value);
      VVar2 = LLVMBC::Value::get_value_kind(pVVar5);
      bVar10 = VVar2 == Load;
    }
    if ((2 < uVar9) || (uVar9 = uVar9 + 1, !bVar10)) goto LAB_0017c261;
  } while( true );
}

Assistant:

static bool validate_wmma_io_registers(Converter::Impl &impl, uint32_t base_argument,
                                       AmdExtD3DShaderIntrinsicsWaveMatrixRegType reg_type,
                                       uint32_t phase, bool input_validation)
{
	if (reg_type == AmdExtD3DShaderIntrinsicsWaveMatrixRegType_RetVal_Reg && !input_validation)
	{
		// 8 outputs
		for (uint32_t i = 0; i < 8; i++)
		{
			uint32_t inst_index = base_argument + i;
			uint32_t imm = impl.ags.instructions[inst_index].immediate;
			uint32_t channel = get_matrix_io_channel(imm);
			uint32_t reg = get_matrix_io_register(imm);
			uint32_t type = get_matrix_io_type(imm);

			if (impl.ags.instructions[inst_index].phase != phase)
				return false;

			// Check for unexpected cases.
			if ((imm >> AmdExtD3DShaderIntrinsicsWaveMatrixModifier_MatrixTileShift) != 0)
				return false;
			if (type != reg_type)
				return false;
			if (channel != i % 4 || reg != i / 4)
				return false;
		}
	}
	else
	{
		spv::Id coopmat_id = impl.get_id_for_value(impl.ags.backdoor_instructions[base_argument]->getOperand(5));

		// If the matrix is PHI or loaded from alloca, we only check component mapping.
		bool all_phi_or_load = true;
		for (uint32_t i = 0; i < 4 && all_phi_or_load; i++)
		{
			uint32_t inst_index = base_argument + i;
			const auto *value0 = impl.ags.backdoor_instructions[inst_index]->getOperand(5);
			const auto *value1 = impl.ags.backdoor_instructions[inst_index]->getOperand(6);
			all_phi_or_load =
				(llvm::isa<llvm::PHINode>(value0) || llvm::isa<llvm::LoadInst>(value0)) &&
				(llvm::isa<llvm::PHINode>(value1) || llvm::isa<llvm::LoadInst>(value1));
		}

		// 4x2 inputs.
		for (uint32_t i = 0; i < 4; i++)
		{
			uint32_t inst_index = base_argument + i;
			const auto *value0 = impl.ags.backdoor_instructions[inst_index]->getOperand(5);
			const auto *value1 = impl.ags.backdoor_instructions[inst_index]->getOperand(6);
			auto itr0 = impl.ags.coopmat_component_mapping.find(value0);
			auto itr1 = impl.ags.coopmat_component_mapping.find(value1);

			if (impl.ags.instructions[inst_index].phase != phase)
				return false;

			// Don't accept any weird shuffle.
			if (itr0 == impl.ags.coopmat_component_mapping.end() || itr0->second.component != 2 * i + 0 ||
			    (!all_phi_or_load && impl.get_id_for_value(value0) != coopmat_id))
			{
				return false;
			}

			if (itr1 == impl.ags.coopmat_component_mapping.end() || itr1->second.component != 2 * i + 1 ||
			    (!all_phi_or_load && impl.get_id_for_value(value1) != coopmat_id))
			{
				return false;
			}

			uint32_t imm = impl.ags.instructions[inst_index].immediate;

			uint32_t channel = get_matrix_io_channel(imm);
			uint32_t reg = get_matrix_io_register(imm);
			uint32_t type = get_matrix_io_type(imm);

			// Check for unexpected cases.
			if ((imm >> AmdExtD3DShaderIntrinsicsWaveMatrixModifier_MatrixTileShift) != 0)
				return false;
			if (type != reg_type)
				return false;
			if (channel != i % 2 || reg != i / 2)
				return false;
		}
	}

	return true;
}